

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDebuggerVariables.cxx
# Opt level: O2

array<dap::Variable> * __thiscall
cmDebugger::cmDebuggerVariables::HandleVariablesRequest
          (array<dap::Variable> *__return_storage_ptr__,cmDebuggerVariables *this)

{
  pointer pVVar1;
  pointer pVVar2;
  long lVar3;
  bool bVar4;
  ulong uVar5;
  __normal_iterator<dap::Variable_*,_std::vector<dap::Variable,_std::allocator<dap::Variable>_>_>
  __i;
  pointer pVVar6;
  string *psVar7;
  vector<cmDebugger::cmDebuggerVariableEntry,_std::allocator<cmDebugger::cmDebuggerVariableEntry>_>
  values;
  vector<cmDebugger::cmDebuggerVariableEntry,_std::allocator<cmDebugger::cmDebuggerVariableEntry>_>
  local_1a8;
  undefined1 local_190 [128];
  integer local_110;
  undefined8 uStack_108;
  optional<dap::VariablePresentationHint> local_100;
  _Alloc_hider local_80;
  size_type local_78;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_70;
  undefined8 local_60;
  string local_58 [32];
  integer local_38;
  
  (__return_storage_ptr__->super__Vector_base<dap::Variable,_std::allocator<dap::Variable>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<dap::Variable,_std::allocator<dap::Variable>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<dap::Variable,_std::allocator<dap::Variable>_>).
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  if ((this->GetKeyValuesFunction).super__Function_base._M_manager != (_Manager_type)0x0) {
    std::
    function<std::vector<cmDebugger::cmDebuggerVariableEntry,_std::allocator<cmDebugger::cmDebuggerVariableEntry>_>_()>
    ::operator()(&local_1a8,&this->GetKeyValuesFunction);
    for (psVar7 = (string *)
                  &(local_1a8.
                    super__Vector_base<cmDebugger::cmDebuggerVariableEntry,_std::allocator<cmDebugger::cmDebuggerVariableEntry>_>
                    ._M_impl.super__Vector_impl_data._M_start)->Value;
        (pointer)(psVar7 + -0x20) !=
        local_1a8.
        super__Vector_base<cmDebugger::cmDebuggerVariableEntry,_std::allocator<cmDebugger::cmDebuggerVariableEntry>_>
        ._M_impl.super__Vector_impl_data._M_finish; psVar7 = psVar7 + 0x60) {
      if (this->IgnoreEmptyStringEntries == true) {
        bVar4 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )(psVar7 + 0x20),"string");
        if ((!bVar4) || (*(long *)(psVar7 + 8) != 0)) goto LAB_0046fda3;
      }
      else {
LAB_0046fda3:
        local_190._16_8_ = 0;
        local_190._24_8_ = 0;
        local_190._8_8_ = 0;
        local_190._32_8_ = 0;
        local_190._80_8_ = 0;
        local_190._88_8_ = 0;
        local_190._64_8_ = 0;
        local_190._40_8_ = 0;
        local_190._48_8_ = 0;
        local_190._56_8_ = local_190 + 0x48;
        local_190._72_8_ = 0;
        local_190._0_8_ = local_190 + 0x10;
        std::__cxx11::string::string((string *)(local_190 + 0x60),psVar7 + -0x20);
        local_110.val = 0;
        uStack_108._0_1_ = false;
        uStack_108._1_7_ = 0;
        dap::optional<dap::VariablePresentationHint>::
        optional<dap::VariablePresentationHint_const&,void>
                  (&local_100,(VariablePresentationHint *)(anonymous_namespace)::PrivateDataHint);
        if (this->SupportsVariableType == true) {
          dap::optional<std::__cxx11::string>::optional<std::__cxx11::string_const&,void>
                    ((optional<std::__cxx11::string> *)&local_80,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     (psVar7 + 0x20));
        }
        else {
          local_80._M_p = (pointer)&local_70;
          local_70._M_allocated_capacity = 0;
          local_70._8_8_ = 0;
          local_78 = 0;
          local_60._0_1_ = false;
          local_60._1_7_ = 0;
        }
        std::__cxx11::string::string(local_58,psVar7);
        local_38.val = 0;
        std::vector<dap::Variable,_std::allocator<dap::Variable>_>::emplace_back<dap::Variable>
                  (__return_storage_ptr__,(Variable *)local_190);
        dap::Variable::~Variable((Variable *)local_190);
      }
    }
    std::
    vector<cmDebugger::cmDebuggerVariableEntry,_std::allocator<cmDebugger::cmDebuggerVariableEntry>_>
    ::~vector(&local_1a8);
  }
  EnumerateSubVariablesIfAny(this,__return_storage_ptr__);
  if (this->EnableSorting == true) {
    pVVar1 = (__return_storage_ptr__->
             super__Vector_base<dap::Variable,_std::allocator<dap::Variable>_>)._M_impl.
             super__Vector_impl_data._M_start;
    pVVar2 = (__return_storage_ptr__->
             super__Vector_base<dap::Variable,_std::allocator<dap::Variable>_>)._M_impl.
             super__Vector_impl_data._M_finish;
    if (pVVar1 != pVVar2) {
      uVar5 = ((long)pVVar2 - (long)pVVar1) / 0x160;
      lVar3 = 0x3f;
      if (uVar5 != 0) {
        for (; uVar5 >> lVar3 == 0; lVar3 = lVar3 + -1) {
        }
      }
      std::
      __introsort_loop<__gnu_cxx::__normal_iterator<dap::Variable*,std::vector<dap::Variable,std::allocator<dap::Variable>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<cmDebugger::cmDebuggerVariables::HandleVariablesRequest()::__0>>
                (pVVar1,pVVar2,((uint)lVar3 ^ 0x3f) * 2 ^ 0x7e);
      if ((long)pVVar2 - (long)pVVar1 < 0x1601) {
        std::
        __insertion_sort<__gnu_cxx::__normal_iterator<dap::Variable*,std::vector<dap::Variable,std::allocator<dap::Variable>>>,__gnu_cxx::__ops::_Iter_comp_iter<cmDebugger::cmDebuggerVariables::HandleVariablesRequest()::__0>>
                  (pVVar1,pVVar2);
      }
      else {
        pVVar6 = pVVar1 + 0x10;
        std::
        __insertion_sort<__gnu_cxx::__normal_iterator<dap::Variable*,std::vector<dap::Variable,std::allocator<dap::Variable>>>,__gnu_cxx::__ops::_Iter_comp_iter<cmDebugger::cmDebuggerVariables::HandleVariablesRequest()::__0>>
                  (pVVar1,pVVar6);
        for (; pVVar6 != pVVar2; pVVar6 = pVVar6 + 1) {
          std::
          __unguarded_linear_insert<__gnu_cxx::__normal_iterator<dap::Variable*,std::vector<dap::Variable,std::allocator<dap::Variable>>>,__gnu_cxx::__ops::_Val_comp_iter<cmDebugger::cmDebuggerVariables::HandleVariablesRequest()::__0>>
                    (pVVar6);
        }
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

dap::array<dap::Variable> cmDebuggerVariables::HandleVariablesRequest()
{
  dap::array<dap::Variable> variables;

  if (GetKeyValuesFunction != nullptr) {
    auto values = GetKeyValuesFunction();
    for (auto const& entry : values) {
      if (IgnoreEmptyStringEntries && entry.Type == "string" &&
          entry.Value.empty()) {
        continue;
      }
      variables.push_back(dap::Variable{
        {},
        {},
        {},
        entry.Name,
        {},
        PrivateDataHint,
        SupportsVariableType ? entry.Type : dap::optional<dap::string>(),
        entry.Value,
        0 });
    }
  }

  EnumerateSubVariablesIfAny(variables);

  if (EnableSorting) {
    std::sort(variables.begin(), variables.end(),
              [](dap::Variable const& a, dap::Variable const& b) {
                return a.name < b.name;
              });
  }
  return variables;
}